

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.h
# Opt level: O1

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::add_output
          (VisionFeaturePrint_Objects *this,char *value)

{
  int iVar1;
  Rep *pRVar2;
  Arena *this_00;
  char *pcVar3;
  LogMessage *other;
  long *elem;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/../src/../build/format/VisionFeaturePrint.pb.h"
               ,500);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: value != NULL: ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  pRVar2 = (this->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_001a1099:
    google::protobuf::internal::RepeatedPtrFieldBase::Reserve
              (&(this->output_).super_RepeatedPtrFieldBase,
               (this->output_).super_RepeatedPtrFieldBase.total_size_ + 1);
  }
  else {
    iVar1 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      (this->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      elem = (long *)pRVar2->elements[iVar1];
      goto LAB_001a112b;
    }
    if (pRVar2->allocated_size == (this->output_).super_RepeatedPtrFieldBase.total_size_)
    goto LAB_001a1099;
  }
  pRVar2 = (this->output_).super_RepeatedPtrFieldBase.rep_;
  pRVar2->allocated_size = pRVar2->allocated_size + 1;
  this_00 = (this->output_).super_RepeatedPtrFieldBase.arena_;
  if (this_00 == (Arena *)0x0) {
    elem = (long *)operator_new(0x20);
    *elem = (long)(elem + 2);
    elem[1] = 0;
    *(undefined1 *)(elem + 2) = 0;
  }
  else {
    elem = (long *)google::protobuf::Arena::AllocateAligned
                             (this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    *elem = (long)(elem + 2);
    elem[1] = 0;
    *(undefined1 *)(elem + 2) = 0;
    google::protobuf::Arena::AddListNode
              (this_00,elem,google::protobuf::internal::arena_destruct_object<std::__cxx11::string>)
    ;
  }
  pRVar2 = (this->output_).super_RepeatedPtrFieldBase.rep_;
  iVar1 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
  (this->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
  pRVar2->elements[iVar1] = elem;
LAB_001a112b:
  pcVar3 = (char *)elem[1];
  strlen(value);
  std::__cxx11::string::_M_replace((ulong)elem,0,pcVar3,(ulong)value);
  return;
}

Assistant:

inline void VisionFeaturePrint_Objects::add_output(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  output_.Add()->assign(value);
  // @@protoc_insertion_point(field_add_char:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.output)
}